

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O0

void lowbd_fwd_txfm2d_64x64_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  undefined1 auVar1 [12];
  long in_RSI;
  undefined1 auVar2 [16];
  int j_1;
  __m128i *buf;
  __m128i bufB [64];
  __m128i bufA [64];
  int i_1;
  int j;
  int i;
  int height_div8;
  int width_div8;
  transform_1d_sse2 col_txfm;
  int height;
  int width;
  int cos_bit_row;
  int cos_bit_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i buf1 [512];
  __m128i buf0 [64];
  TX_SIZE tx_size;
  int8_t in_stack_000046c7;
  __m128i *in_stack_000046c8;
  __m128i *in_stack_000046d0;
  int in_stack_ffffffffffffd34c;
  int iVar3;
  __m128i *in_stack_ffffffffffffd350;
  undefined8 *puVar4;
  undefined4 in_stack_ffffffffffffd358;
  int in_stack_ffffffffffffd35c;
  __m128i *in_stack_ffffffffffffd360;
  __m128i *in_stack_ffffffffffffd3c0;
  __m128i *in_stack_ffffffffffffd3c8;
  longlong local_28a8 [128];
  int local_24a4;
  int local_24a0;
  int local_249c;
  undefined4 local_2498;
  undefined4 local_2494;
  code *local_2490;
  undefined4 local_2488;
  undefined4 local_2484;
  int local_2480;
  int local_247c;
  int local_2478;
  int local_2474;
  char *local_2470;
  undefined8 local_2468 [1024];
  longlong local_468 [128];
  undefined1 local_65;
  long local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_65 = 4;
  local_2470 = av1_fwd_txfm_shift_ls[4];
  local_58 = in_RSI;
  local_2474 = get_txw_idx('\x04');
  local_2478 = get_txh_idx('\x04');
  local_247c = (int)av1_fwd_cos_bit_col[local_2474][local_2478];
  local_2480 = (int)av1_fwd_cos_bit_row[local_2474][local_2478];
  local_2484 = 0x40;
  local_2488 = 0x40;
  local_2490 = av1_fdct8x64_new_sse2;
  local_2494 = 8;
  local_2498 = 8;
  for (local_249c = 0; local_249c < 8; local_249c = local_249c + 1) {
    load_buffer_16bit_to_16bit
              ((int16_t *)in_stack_ffffffffffffd360,in_stack_ffffffffffffd35c,
               in_stack_ffffffffffffd350,in_stack_ffffffffffffd34c);
    round_shift_16bit((__m128i *)local_468,0x40,(int)*local_2470);
    av1_fdct8x64_new_sse2(in_stack_000046d0,in_stack_000046c8,in_stack_000046c7);
    round_shift_16bit((__m128i *)local_468,0x40,(int)local_2470[1]);
    for (local_24a0 = 0; local_24a0 < 4; local_24a0 = local_24a0 + 1) {
      transpose_16bit_8x8(in_stack_ffffffffffffd3c8,in_stack_ffffffffffffd3c0);
    }
  }
  for (local_24a4 = 0; local_24a4 < 4; local_24a4 = local_24a4 + 1) {
    puVar4 = local_2468 + (long)(local_24a4 << 6) * 2;
    for (iVar3 = 0; iVar3 < 0x40; iVar3 = iVar3 + 1) {
      local_38 = *(undefined1 (*) [16])(puVar4 + (long)iVar3 * 2);
      auVar2 = pmovsxwd(local_38,local_38._0_8_);
      *(undefined1 (*) [16])(local_28a8 + (long)iVar3 * 2) = auVar2;
      local_28 = puVar4[(long)iVar3 * 2];
      uStack_20 = (puVar4 + (long)iVar3 * 2)[1];
      local_18._4_4_ = (undefined4)((ulong)local_28 >> 0x20);
      uStack_10._0_4_ = (undefined4)uStack_20;
      uStack_10._4_4_ = (undefined4)((ulong)uStack_20 >> 0x20);
      auVar1._4_8_ = uStack_20;
      auVar1._0_4_ = local_18._4_4_;
      auVar2._0_8_ = auVar1._0_8_ << 0x20;
      auVar2._8_4_ = (undefined4)uStack_10;
      auVar2._12_4_ = uStack_10._4_4_;
      local_48._8_8_ = uStack_20;
      local_48._0_8_ = auVar2._8_8_;
      auVar2 = pmovsxwd(local_48,auVar2._8_8_);
      *(undefined1 (*) [16])(&stack0xffffffffffffd358 + (long)iVar3 * 0x10) = auVar2;
      local_18 = local_28;
      uStack_10 = uStack_20;
    }
    av1_fdct64_sse4_1((__m128i *)buf1[0xc5][1],(__m128i *)buf1[0xc5][0],buf1[0xc4][1]._7_1_,
                      (int)buf1[0xc4][1],buf1[0xc4][0]._4_4_);
    av1_fdct64_sse4_1((__m128i *)buf1[0xc5][1],(__m128i *)buf1[0xc5][0],buf1[0xc4][1]._7_1_,
                      (int)buf1[0xc4][1],buf1[0xc4][0]._4_4_);
    av1_round_shift_array_32_sse4_1
              (in_stack_ffffffffffffd360,
               (__m128i *)CONCAT44(in_stack_ffffffffffffd35c,in_stack_ffffffffffffd358),
               (int)((ulong)puVar4 >> 0x20),(int)puVar4);
    av1_round_shift_array_32_sse4_1
              (in_stack_ffffffffffffd360,
               (__m128i *)CONCAT44(in_stack_ffffffffffffd35c,in_stack_ffffffffffffd358),
               (int)((ulong)puVar4 >> 0x20),(int)puVar4);
    store_output_32bit_w8
              ((int32_t *)(local_58 + (long)(local_24a4 << 3) * 4),(__m128i *)local_28a8,
               (__m128i *)&stack0xffffffffffffd358,0x20,0x20);
  }
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_64x64_sse4_1(const int16_t *input, int32_t *output,
                                          int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X64;
  __m128i buf0[64], buf1[512];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_sse2 col_txfm = av1_fdct8x64_new_sse2;
  const int width_div8 = (width >> 3);
  const int height_div8 = (height >> 3);

  for (int i = 0; i < width_div8; i++) {
    load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(4, height_div8); ++j) {
      transpose_16bit_8x8(buf0 + j * 8, buf1 + j * width + 8 * i);
    }
  }
  for (int i = 0; i < AOMMIN(4, height_div8); i++) {
    __m128i bufA[64];
    __m128i bufB[64];
    __m128i *buf = buf1 + width * i;
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm_cvtepi16_epi32(buf[j]);
      bufB[j] = _mm_cvtepi16_epi32(_mm_unpackhi_epi64(buf[j], buf[j]));
    }
    av1_fdct64_sse4_1(bufA, bufA, cos_bit_row, 1, 1);
    av1_fdct64_sse4_1(bufB, bufB, cos_bit_row, 1, 1);
    av1_round_shift_array_32_sse4_1(bufA, bufA, 32, -shift[2]);
    av1_round_shift_array_32_sse4_1(bufB, bufB, 32, -shift[2]);

    store_output_32bit_w8(output + i * 8, bufA, bufB, 32, 32);
  }
}